

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::splitBuiltIn
          (HlslParseContext *this,TString *baseName,TType *memberType,TArraySizes *arraySizes,
          TQualifier *outerQualifier)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  iterator iVar3;
  undefined4 extraout_var_00;
  TVariable *pTVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *ppTVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *dst;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  bVar1 = isClipOrCullDistance(memberType);
  if (!bVar1) {
    iVar2 = (*memberType->_vptr_TType[0xb])(memberType);
    local_80._M_dataplus.super_allocator_type.allocator._0_4_ =
         *(uint *)(CONCAT44(extraout_var,iVar2) + 8) >> 7 & 0x1ff;
    local_80._M_dataplus.super_allocator_type.allocator._4_4_ =
         *(uint *)&outerQualifier->field_0x8 & 0x7f;
    iVar3 = std::
            _Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::find((_Rb_tree<glslang::HlslParseContext::tInterstageIoData,_std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>,_std::_Select1st<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                    *)&this->splitBuiltIns,(key_type *)&local_80);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->splitBuiltIns).
         super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
  }
  std::operator+(&local_58,baseName,".");
  iVar2 = (*memberType->_vptr_TType[6])(memberType);
  std::operator+(&local_80,&local_58,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_00,iVar2));
  pTVar4 = makeInternalVariable(this,local_80._M_dataplus._M_p,memberType);
  if ((arraySizes != (TArraySizes *)0x0) &&
     (iVar2 = (*memberType->_vptr_TType[0x1d])(memberType), (char)iVar2 == '\0')) {
    iVar2 = (*(pTVar4->super_TSymbol)._vptr_TSymbol[0xd])(pTVar4);
    TType::copyArraySizes((TType *)CONCAT44(extraout_var_01,iVar2),arraySizes);
  }
  iVar2 = (*memberType->_vptr_TType[0xb])(memberType);
  local_80._M_dataplus.super_allocator_type.allocator._0_4_ =
       *(uint *)(CONCAT44(extraout_var_02,iVar2) + 8) >> 7 & 0x1ff;
  local_80._M_dataplus.super_allocator_type.allocator._4_4_ =
       *(uint *)&outerQualifier->field_0x8 & 0x7f;
  ppTVar5 = std::
            map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::operator[](&(this->splitBuiltIns).
                          super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                         ,(key_type *)&local_80);
  *ppTVar5 = pTVar4;
  iVar2 = (*(pTVar4->super_TSymbol)._vptr_TSymbol[0xc])(pTVar4);
  bVar1 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_03,iVar2));
  if (!bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])(this,pTVar4);
  }
  iVar2 = (*(pTVar4->super_TSymbol)._vptr_TSymbol[0xd])(pTVar4);
  dst = (TQualifier *)
        (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x50))
                  ((long *)CONCAT44(extraout_var_04,iVar2));
  mergeQualifiers(this,dst,outerQualifier);
  iVar2 = (*(pTVar4->super_TSymbol)._vptr_TSymbol[0xd])(pTVar4);
  fixBuiltInIoType(this,(TType *)CONCAT44(extraout_var_05,iVar2));
  iVar2 = (*(pTVar4->super_TSymbol)._vptr_TSymbol[0xd])(pTVar4);
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x50))
                    ((long *)CONCAT44(extraout_var_06,iVar2));
  *(ushort *)(lVar6 + 0x1c) = *(ushort *)(lVar6 + 0x1c) | 0xfff;
  return;
}

Assistant:

void HlslParseContext::splitBuiltIn(const TString& baseName, const TType& memberType, const TArraySizes* arraySizes,
                                    const TQualifier& outerQualifier)
{
    // Because of arrays of structs, we might be asked more than once,
    // but the arraySizes passed in should have captured the whole thing
    // the first time.
    // However, clip/cull rely on multiple updates.
    if (!isClipOrCullDistance(memberType))
        if (splitBuiltIns.find(tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)) !=
            splitBuiltIns.end())
            return;

    TVariable* ioVar = makeInternalVariable(baseName + "." + memberType.getFieldName(), memberType);

    if (arraySizes != nullptr && !memberType.isArray())
        ioVar->getWritableType().copyArraySizes(*arraySizes);

    splitBuiltIns[tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)] = ioVar;
    if (!isClipOrCullDistance(ioVar->getType()))
        trackLinkage(*ioVar);

    // Merge qualifier from the user structure
    mergeQualifiers(ioVar->getWritableType().getQualifier(), outerQualifier);

    // Fix the builtin type if needed (e.g, some types require fixed array sizes, no matter how the
    // shader declared them).  This is done after mergeQualifiers(), in case fixBuiltInIoType looks
    // at the qualifier to determine e.g, in or out qualifications.
    fixBuiltInIoType(ioVar->getWritableType());

    // But, not location, we're losing that
    ioVar->getWritableType().getQualifier().layoutLocation = TQualifier::layoutLocationEnd;
}